

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  char *__s1;
  long lVar5;
  int local_34;
  int kerror_1;
  int i_1;
  int kerror;
  int i;
  png_structp dummy_ptr;
  int ierror;
  int multiple;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  dummy_ptr._4_4_ = 0;
  dummy_ptr._0_4_ = 0;
  _ierror = argv;
  argv_local._0_4_ = argc;
  fprintf(_stdout,"\n Testing libpng version %s\n","1.6.48.git");
  fprintf(_stdout,"   with zlib   version %s\n","1.2.11");
  pFVar1 = _stdout;
  uVar4 = png_get_copyright(0);
  fprintf(pFVar1,"%s",uVar4);
  pFVar1 = _stdout;
  uVar2 = png_access_version_number();
  uVar4 = png_get_header_version(0);
  fprintf(pFVar1," library (%lu):%s",(ulong)uVar2,uVar4);
  fprintf(_stdout," pngtest (%lu):%s",0x2998," libpng version 1.6.48.git\n");
  __s1 = (char *)png_get_header_ver(0);
  iVar3 = strcmp(__s1,"1.6.48.git");
  if (iVar3 != 0) {
    fprintf(_stdout,"Warning: mismatching versions of png.h and png.c\n");
    fprintf(_stdout,"  png.h version string: %s\n","1.6.48.git");
    pFVar1 = _stdout;
    uVar4 = png_get_header_ver(0);
    fprintf(pFVar1,"  png.c version string: %s\n\n",uVar4);
    dummy_ptr._0_4_ = (int)dummy_ptr + 1;
  }
  if (1 < (int)argv_local) {
    iVar3 = strcmp(_ierror[1],"-m");
    if (iVar3 == 0) {
      dummy_ptr._4_4_ = 1;
      status_dots_requested = 0;
    }
    else {
      iVar3 = strcmp(_ierror[1],"-mv");
      if ((iVar3 == 0) || (iVar3 = strcmp(_ierror[1],"-vm"), iVar3 == 0)) {
        dummy_ptr._4_4_ = 1;
        verbose = 1;
        status_dots_requested = 1;
      }
      else {
        iVar3 = strcmp(_ierror[1],"-v");
        if (iVar3 == 0) {
          verbose = 1;
          status_dots_requested = 1;
          inname = _ierror[2];
        }
        else {
          iVar3 = strcmp(_ierror[1],"--strict");
          if (iVar3 == 0) {
            verbose = 1;
            inname = _ierror[2];
            strict = strict + 1;
            relaxed = 0;
            dummy_ptr._4_4_ = 1;
          }
          else {
            iVar3 = strcmp(_ierror[1],"--relaxed");
            if (iVar3 == 0) {
              verbose = 1;
              inname = _ierror[2];
              strict = 0;
              relaxed = relaxed + 1;
              dummy_ptr._4_4_ = 1;
            }
            else {
              iVar3 = strcmp(_ierror[1],"--xfail");
              if (iVar3 == 0) {
                verbose = 1;
                inname = _ierror[2];
                strict = 0;
                xfail = xfail + 1;
                relaxed = relaxed + 1;
                dummy_ptr._4_4_ = 1;
              }
              else {
                inname = _ierror[1];
              }
            }
          }
          status_dots_requested = 0;
        }
      }
    }
  }
  if ((dummy_ptr._4_4_ == 0) && ((int)argv_local == verbose + 3)) {
    outname = _ierror[verbose + 2];
  }
  if (((dummy_ptr._4_4_ != 0) || ((int)argv_local <= verbose + 3)) &&
     ((dummy_ptr._4_4_ == 0 || (1 < (int)argv_local)))) {
    if (dummy_ptr._4_4_ == 0) {
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        if (local_34 == 1) {
          status_dots_requested = 1;
        }
        else if (verbose == 0) {
          status_dots_requested = 0;
        }
        if (((local_34 == 0) || (verbose == 1)) || ((int)dummy_ptr != 0)) {
          fprintf(_stdout,"\n Testing %s:",inname);
        }
        iVar3 = test_one_file(inname,outname);
        if (iVar3 == 0) {
          if (((verbose == 1) || (local_34 == 2)) &&
             (fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples),
             tIME_chunk_present != 0)) {
            fprintf(_stdout," tIME = %s\n",tIME_string);
          }
        }
        else {
          if ((verbose == 0) && (local_34 != 2)) {
            fprintf(_stdout,"\n Testing %s:",inname);
          }
          if (xfail == 0) {
            fprintf(_stdout," FAIL\n");
            dummy_ptr._0_4_ = iVar3 + (int)dummy_ptr;
          }
          else {
            fprintf(_stdout," XFAIL\n");
          }
        }
      }
    }
    else {
      for (i_1 = 2; i_1 < (int)argv_local; i_1 = i_1 + 1) {
        fprintf(_stdout,"\n Testing %s:",_ierror[i_1]);
        iVar3 = test_one_file(_ierror[i_1],outname);
        if (iVar3 == 0) {
          fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples);
          if (tIME_chunk_present != 0) {
            fprintf(_stdout," tIME = %s\n",tIME_string);
          }
          tIME_chunk_present = 0;
        }
        else if (xfail == 0) {
          fprintf(_stdout," FAIL\n");
          dummy_ptr._0_4_ = iVar3 + (int)dummy_ptr;
        }
        else {
          fprintf(_stdout," XFAIL\n");
        }
      }
    }
    if ((int)dummy_ptr == 0) {
      fprintf(_stdout," libpng passes test\n");
    }
    else {
      fprintf(_stdout," libpng FAILS test\n");
    }
    _kerror = png_create_read_struct("1.6.48.git",0,0);
    fprintf(_stdout," Default limits:\n");
    pFVar1 = _stdout;
    uVar2 = png_get_user_width_max(_kerror);
    fprintf(pFVar1,"  width_max  = %lu\n",(ulong)uVar2);
    pFVar1 = _stdout;
    uVar2 = png_get_user_height_max(_kerror);
    fprintf(pFVar1,"  height_max = %lu\n",(ulong)uVar2);
    iVar3 = png_get_chunk_cache_max(_kerror);
    pFVar1 = _stdout;
    if (iVar3 == 0) {
      fprintf(_stdout,"  cache_max  = unlimited\n");
    }
    else {
      uVar2 = png_get_chunk_cache_max(_kerror);
      fprintf(pFVar1,"  cache_max  = %lu\n",(ulong)uVar2);
    }
    lVar5 = png_get_chunk_malloc_max(_kerror);
    pFVar1 = _stdout;
    if (lVar5 == 0) {
      fprintf(_stdout,"  malloc_max = unlimited\n");
    }
    else {
      uVar4 = png_get_chunk_malloc_max(_kerror);
      fprintf(pFVar1,"  malloc_max = %lu\n",uVar4);
    }
    png_destroy_read_struct(&kerror,0);
    return (int)((int)dummy_ptr != 0);
  }
  fprintf(_stdout,"usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",*_ierror,*_ierror);
  fprintf(_stdout,"  reads/writes one PNG file (without -m) or multiple files (-m)\n");
  fprintf(_stdout,"  with -m %s is used as a temporary file\n",outname);
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
   int multiple = 0;
   int ierror = 0;

   png_structp dummy_ptr;

   fprintf(STDERR, "\n Testing libpng version %s\n", PNG_LIBPNG_VER_STRING);
   fprintf(STDERR, "   with zlib   version %s\n", ZLIB_VERSION);
   fprintf(STDERR, "%s", png_get_copyright(NULL));
   /* Show the version of libpng used in building the library */
   fprintf(STDERR, " library (%lu):%s",
       (unsigned long)png_access_version_number(),
       png_get_header_version(NULL));

   /* Show the version of libpng used in building the application */
   fprintf(STDERR, " pngtest (%lu):%s", (unsigned long)PNG_LIBPNG_VER,
       PNG_HEADER_VERSION_STRING);

   /* Do some consistency checking on the memory allocation settings, I'm
    * not sure this matters, but it is nice to know, the first of these
    * tests should be impossible because of the way the macros are set
    * in pngconf.h
    */
#if defined(MAXSEG_64K) && !defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: Zlib compiled for max 64k, libpng not\n");
#endif
   /* I think the following can happen. */
#if !defined(MAXSEG_64K) && defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: libpng compiled for max 64k, zlib not\n");
#endif

   if (strcmp(png_libpng_ver, PNG_LIBPNG_VER_STRING) != 0)
   {
      fprintf(STDERR, "Warning: mismatching versions of png.h and png.c\n");
      fprintf(STDERR, "  png.h version string: %s\n", PNG_LIBPNG_VER_STRING);
      fprintf(STDERR, "  png.c version string: %s\n\n", png_libpng_ver);
      ++ierror;
   }

   if (argc > 1)
   {
      if (strcmp(argv[1], "-m") == 0)
      {
         multiple = 1;
         status_dots_requested = 0;
      }

      else if (strcmp(argv[1], "-mv") == 0 ||
               strcmp(argv[1], "-vm") == 0 )
      {
         multiple = 1;
         verbose = 1;
         status_dots_requested = 1;
      }

      else if (strcmp(argv[1], "-v") == 0)
      {
         verbose = 1;
         status_dots_requested = 1;
         inname = argv[2];
      }

      else if (strcmp(argv[1], "--strict") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict++;
         relaxed = 0;
         multiple = 1;
      }

      else if (strcmp(argv[1], "--relaxed") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         relaxed++;
         multiple = 1;
      }
      else if (strcmp(argv[1], "--xfail") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         xfail++;
         relaxed++;
         multiple = 1;
      }

      else
      {
         inname = argv[1];
         status_dots_requested = 0;
      }
   }

   if (multiple == 0 && argc == 3 + verbose)
      outname = argv[2 + verbose];

   if ((multiple == 0 && argc > 3 + verbose) ||
       (multiple != 0 && argc < 2))
   {
      fprintf(STDERR,
          "usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",
          argv[0], argv[0]);
      fprintf(STDERR,
          "  reads/writes one PNG file (without -m) or multiple files (-m)\n");
      fprintf(STDERR,
          "  with -m %s is used as a temporary file\n", outname);
      exit(1);
   }

   if (multiple != 0)
   {
      int i;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
      int allocation_now = current_allocation;
#endif
      for (i = 2; i < argc; ++i)
      {
         int kerror;
         fprintf(STDERR, "\n Testing %s:", argv[i]);
#if PNG_DEBUG > 0
         fprintf(STDERR, "\n");
#endif
         kerror = test_one_file(argv[i], outname);
         if (kerror == 0)
         {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
            fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                (unsigned long)zero_samples);
#else
            fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
            if (tIME_chunk_present != 0)
               fprintf(STDERR, " tIME = %s\n", tIME_string);

            tIME_chunk_present = 0;
#endif /* TIME_RFC1123 */
         }

         else
         {
            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
            fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                current_allocation - allocation_now);

         if (current_allocation != 0)
         {
            memory_infop pinfo = pinformation;

            fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                current_allocation);

            while (pinfo != NULL)
            {
               fprintf(STDERR, " %lu bytes at %p\n",
                   (unsigned long)pinfo->size,
                   pinfo->pointer);
               pinfo = pinfo->next;
            }
         }
#endif
      }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         fprintf(STDERR, " Current memory allocation: %10d bytes\n",
             current_allocation);
         fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
             maximum_allocation);
         fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
             total_allocation);
         fprintf(STDERR, "     Number of allocations: %10d\n",
             num_allocations);
#endif
   }

   else
   {
      int i;
      for (i = 0; i < 3; ++i)
      {
         int kerror;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         int allocation_now = current_allocation;
#endif
         if (i == 1)
            status_dots_requested = 1;

         else if (verbose == 0)
            status_dots_requested = 0;

         if (i == 0 || verbose == 1 || ierror != 0)
         {
            fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
            fprintf(STDERR, "\n");
#endif
         }

         kerror = test_one_file(inname, outname);

         if (kerror == 0)
         {
            if (verbose == 1 || i == 2)
            {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
                fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                    (unsigned long)zero_samples);
#else
                fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
             if (tIME_chunk_present != 0)
                fprintf(STDERR, " tIME = %s\n", tIME_string);
#endif /* TIME_RFC1123 */
            }
         }

         else
         {
            if (verbose == 0 && i != 2)
            {
               fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
               fprintf(STDERR, "\n");
#endif
            }

            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
             fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                 current_allocation - allocation_now);

         if (current_allocation != 0)
         {
             memory_infop pinfo = pinformation;

             fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                 current_allocation);

             while (pinfo != NULL)
             {
                fprintf(STDERR, " %lu bytes at %p\n",
                    (unsigned long)pinfo->size, pinfo->pointer);
                pinfo = pinfo->next;
             }
          }
#endif
       }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
       fprintf(STDERR, " Current memory allocation: %10d bytes\n",
           current_allocation);
       fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
           maximum_allocation);
       fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
           total_allocation);
       fprintf(STDERR, "     Number of allocations: %10d\n",
           num_allocations);
#endif
   }

#ifdef PNGTEST_TIMING
   t_stop = (float)clock();
   t_misc += (t_stop - t_start);
   t_start = t_stop;
   fprintf(STDERR, " CPU time used = %.3f seconds",
       (t_misc+t_decode+t_encode)/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " (decoding %.3f,\n",
       t_decode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, "        encoding %.3f ,",
       t_encode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " other %.3f seconds)\n\n",
       t_misc/(float)CLOCKS_PER_SEC);
#endif

   if (ierror == 0)
      fprintf(STDERR, " libpng passes test\n");

   else
      fprintf(STDERR, " libpng FAILS test\n");

   dummy_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
#ifdef PNG_USER_LIMITS_SUPPORTED
   fprintf(STDERR, " Default limits:\n");
   fprintf(STDERR, "  width_max  = %lu\n",
       (unsigned long) png_get_user_width_max(dummy_ptr));
   fprintf(STDERR, "  height_max = %lu\n",
       (unsigned long) png_get_user_height_max(dummy_ptr));
   if (png_get_chunk_cache_max(dummy_ptr) == 0)
      fprintf(STDERR, "  cache_max  = unlimited\n");
   else
      fprintf(STDERR, "  cache_max  = %lu\n",
          (unsigned long) png_get_chunk_cache_max(dummy_ptr));
   if (png_get_chunk_malloc_max(dummy_ptr) == 0)
      fprintf(STDERR, "  malloc_max = unlimited\n");
   else
      fprintf(STDERR, "  malloc_max = %lu\n",
          (unsigned long) png_get_chunk_malloc_max(dummy_ptr));
#endif
   png_destroy_read_struct(&dummy_ptr, NULL, NULL);

   return (ierror != 0);
}